

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightBounds> * __thiscall
pbrt::PointLight::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,PointLight *this)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  bool bVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM17 [64];
  
  auVar15 = in_ZMM17._0_16_;
  fVar1 = this->scale;
  pfVar6 = (this->I).values.ptr;
  uVar7 = (this->I).values.nStored;
  if (1 < uVar7) {
    uVar7 = uVar7 * 4;
    uVar8 = uVar7 - 4;
    bVar12 = uVar8 == 0;
    pfVar11 = pfVar6;
    pfVar10 = pfVar6;
    do {
      uVar9 = uVar8;
      pfVar10 = pfVar10 + 1;
      auVar15 = vucomiss_avx512f(ZEXT416((uint)*pfVar11));
      pfVar6 = pfVar10;
      if (3 < uVar7 || bVar12) {
        pfVar6 = pfVar11;
      }
      uVar8 = uVar9 - 4;
      bVar12 = uVar8 == 0;
      pfVar11 = pfVar6;
      uVar7 = uVar9;
    } while (!bVar12);
  }
  auVar14 = vxorps_avx512vl(auVar15,auVar15);
  auVar15 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][1]),auVar14)
  ;
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]),
                                auVar14,auVar15);
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]),
                                auVar14,auVar15);
  fVar3 = (this->super_LightBase).renderFromLight.m.m[3][3] + auVar15._0_4_;
  bVar12 = fVar3 == 1.0;
  auVar15 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][1]),auVar14)
  ;
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]),
                                auVar14,auVar15);
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]),
                                auVar14,auVar15);
  fVar4 = (this->super_LightBase).renderFromLight.m.m[0][3] + auVar15._0_4_;
  auVar15 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),auVar14)
  ;
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),
                                auVar14,auVar15);
  auVar15 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),
                                auVar14,auVar15);
  fVar5 = (this->super_LightBase).renderFromLight.m.m[1][3] + auVar15._0_4_;
  auVar15 = vinsertps_avx(ZEXT416((uint)bVar12 * (int)fVar4 + (uint)!bVar12 * (int)(fVar4 / fVar3)),
                          ZEXT416((uint)bVar12 * (int)fVar5 + (uint)!bVar12 * (int)(fVar5 / fVar3)),
                          0x10);
  auVar16 = vmulss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][1]),auVar14)
  ;
  auVar16 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]),
                                auVar14,auVar16);
  auVar14 = vfmadd213ss_avx512f(ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]),
                                auVar14,auVar16);
  fVar4 = (this->super_LightBase).renderFromLight.m.m[2][3] + auVar14._0_4_;
  iVar13 = (uint)bVar12 * (int)fVar4 + (uint)!bVar12 * (int)(fVar4 / fVar3);
  fVar3 = *pfVar6;
  __return_storage_ptr__->set = true;
  uVar2 = vmovlps_avx(auVar15);
  *(undefined8 *)&__return_storage_ptr__->optionalValue = uVar2;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 8) = iVar13;
  uVar2 = vmovlps_avx(auVar15);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar2;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 0x14) = iVar13;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar1 * 12.566371 * fVar3;
  auVar15._0_12_ = ZEXT812(0);
  auVar15._12_4_ = 0;
  auVar15 = vmovhps_avx(auVar15,0xbf8000003f800000);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x1c) = auVar15;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = 0xb33bbd2e;
  (__return_storage_ptr__->optionalValue).__data[0x30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> PointLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Float phi = 4 * Pi * scale * I.MaxValue();
    return LightBounds(Bounds3f(p, p), Vector3f(0, 0, 1), phi, std::cos(Pi),
                       std::cos(Pi / 2), false);
}